

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplicationPrivate::translateTouchCancel(QPointingDevice *device,ulong timestamp)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  QWidget *pQVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  long lVar9;
  ulong uVar10;
  Data *pDVar11;
  long in_FS_OFFSET;
  QMutableTouchEvent touchEvent;
  QWidget *local_b0;
  QArrayDataPointer<QEventPoint> local_a8;
  QHashDummyValue local_89;
  code *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QObject *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  uVar8 = QGuiApplication::keyboardModifiers();
  local_a8.size = 0;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QEventPoint *)0x0;
  QTouchEvent::QTouchEvent((QTouchEvent *)&local_88,0xd1,device,uVar8,&local_a8);
  local_88 = QFontMetrics::leading;
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_a8);
  QPointerEvent::setTimestamp((ulonglong)&local_88);
  local_a8.d = (Data *)0x0;
  lVar1 = *(long *)(*(long *)(device + 8) + 0x160);
  if (lVar1 == 0) {
LAB_002c14ea:
    uVar10 = 0;
    pDVar11 = (Data *)0x0;
LAB_002c14ed:
    if (pDVar11 == (Data *)0x0 && uVar10 == 0) goto LAB_002c1574;
  }
  else {
    lVar2 = *(long *)(*(long *)(device + 8) + 0x168);
    lVar9 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar9);
      lVar4 = *(long *)(lVar3 + 0x20);
      if ((((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
          (pQVar5 = *(QWidget **)(lVar3 + 0x28), pQVar5 != (QWidget *)0x0)) &&
         ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0)) {
        local_b0 = pQVar5;
        QHash<QWidget_*,_QHashDummyValue>::emplace<QHashDummyValue>
                  ((QHash<QWidget_*,_QHashDummyValue> *)&local_a8,&local_b0,&local_89);
      }
      lVar9 = lVar9 + 0x58;
    } while (lVar1 * 0x58 - lVar9 != 0);
    if (local_a8.d == (Data *)0x0) {
      uVar10 = 0;
      pDVar11 = (Data *)0x0;
      goto LAB_002c14ed;
    }
    pDVar11 = local_a8.d;
    if (**(char **)&local_a8.d[2].super_QArrayData == -1) {
      uVar6._0_4_ = local_a8.d[1].super_QArrayData.ref_;
      uVar6._4_4_ = local_a8.d[1].super_QArrayData.flags;
      uVar7 = 1;
      do {
        uVar10 = uVar7;
        if (uVar6 == uVar10) goto LAB_002c14ea;
        uVar7 = uVar10 + 1;
      } while ((*(char **)&local_a8.d[2].super_QArrayData)
               [(ulong)((uint)uVar10 & 0x7f) + (uVar10 >> 7) * 0x90] == -1);
      goto LAB_002c14ed;
    }
    uVar10 = 0;
  }
  do {
    local_48 = *(QObject **)
                (*(long *)(*(long *)&pDVar11[2].super_QArrayData + (uVar10 >> 7) * 0x90 + 0x80) +
                (ulong)*(byte *)(*(long *)&pDVar11[2].super_QArrayData + (uVar10 >> 7) * 0x90 +
                                (ulong)((uint)uVar10 & 0x7f)) * 8);
    QCoreApplication::sendSpontaneousEvent(local_48,(QEvent *)&local_88);
    do {
      if (*(long *)&pDVar11[1].super_QArrayData - 1U == uVar10) {
        pDVar11 = (Data *)0x0;
        uVar10 = 0;
        break;
      }
      uVar10 = uVar10 + 1;
    } while (*(char *)(*(long *)&pDVar11[2].super_QArrayData + (uVar10 >> 7) * 0x90 +
                      (ulong)((uint)uVar10 & 0x7f)) == -1);
  } while ((pDVar11 != (Data *)0x0) || (uVar10 != 0));
LAB_002c1574:
  QHash<QWidget_*,_QHashDummyValue>::~QHash((QHash<QWidget_*,_QHashDummyValue> *)&local_a8);
  QMutableTouchEvent::~QMutableTouchEvent((QMutableTouchEvent *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::translateTouchCancel(const QPointingDevice *device, ulong timestamp)
{
    QMutableTouchEvent touchEvent(QEvent::TouchCancel, device, QGuiApplication::keyboardModifiers());
    touchEvent.setTimestamp(timestamp);

    QSet<QWidget *> widgetsNeedingCancel;
    const QPointingDevicePrivate *devPriv = QPointingDevicePrivate::get(device);
    for (auto &epd : devPriv->activePoints.values()) {
        const auto &pt = epd.eventPoint;
        QObject *target = QMutableEventPoint::target(pt);
        if (target && target->isWidgetType())
            widgetsNeedingCancel.insert(static_cast<QWidget *>(target));
    }
    for (QSet<QWidget *>::const_iterator widIt = widgetsNeedingCancel.constBegin(),
         widItEnd = widgetsNeedingCancel.constEnd(); widIt != widItEnd; ++widIt) {
        QWidget *widget = *widIt;
        touchEvent.setTarget(widget);
        QApplication::sendSpontaneousEvent(widget, &touchEvent);
    }
}